

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O2

wasm_func_t *
wasm_func_new_with_env
          (wasm_store_t *store,wasm_functype_t *type,wasm_func_callback_with_env_t callback,
          void *env,_func_void_void_ptr *finalizer)

{
  FuncType *pFVar1;
  wasm_func_t *this;
  __0 *this_00;
  _Any_data local_158;
  code *local_148;
  code *local_140;
  Ptr local_138;
  RefPtr<wabt::interp::Func> local_120;
  FuncType local_108;
  FuncType wabt_type;
  anon_class_88_4_3c8b320e lambda;
  
  pFVar1 = wasm_externtype_t::As<wabt::interp::FuncType>(&type->super_wasm_externtype_t);
  wabt::interp::FuncType::FuncType(&wabt_type,pFVar1);
  lambda.store = store;
  wabt::interp::FuncType::FuncType(&lambda.wabt_type,&wabt_type);
  lambda.callback = callback;
  lambda.env = env;
  this = (wasm_func_t *)operator_new(0x18);
  wabt::interp::FuncType::FuncType(&local_108,&wabt_type);
  local_158._8_8_ = 0;
  this_00 = (__0 *)operator_new(0x58);
  wasm_func_new_with_env::$_0::__0(this_00,&lambda);
  local_140 = std::
              _Function_handler<wabt::Result_(const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/interp/interp-wasm-c-api.cc:762:17)>
              ::_M_invoke;
  local_148 = std::
              _Function_handler<wabt::Result_(const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/interp/interp-wasm-c-api.cc:762:17)>
              ::_M_manager;
  local_158._M_unused._0_8_ = (undefined8)this_00;
  wabt::interp::HostFunc::New(&local_138,&store->I,&local_108,(Callback *)&local_158);
  wabt::interp::RefPtr<wabt::interp::Func>::RefPtr<wabt::interp::HostFunc>(&local_120,&local_138);
  wasm_func_t::wasm_func_t(this,&local_120);
  wabt::interp::RefPtr<wabt::interp::Func>::reset(&local_120);
  wabt::interp::RefPtr<wabt::interp::HostFunc>::reset(&local_138);
  if (local_148 != (code *)0x0) {
    (*local_148)(&local_158,&local_158,__destroy_functor);
  }
  wabt::interp::FuncType::~FuncType(&local_108);
  wabt::interp::FuncType::~FuncType(&lambda.wabt_type);
  wabt::interp::FuncType::~FuncType(&wabt_type);
  return this;
}

Assistant:

own wasm_func_t* wasm_func_new_with_env(wasm_store_t* store,
                                        const wasm_functype_t* type,
                                        wasm_func_callback_with_env_t callback,
                                        void* env,
                                        void (*finalizer)(void*)) {
  FuncType wabt_type = *type->As<FuncType>();
  auto lambda = [=](const Values& wabt_params, Values& wabt_results,
                    Trap::Ptr* out_trap) -> Result {
    wasm_val_vec_t params, results;
    wasm_val_vec_new_uninitialized(&params, wabt_params.size());
    wasm_val_vec_new_uninitialized(&results, wabt_results.size());
    FromWabtValues(store->I, params.data, wabt_type.params, wabt_params);
    auto trap = callback(env, params.data, results.data);
    wasm_val_vec_delete(&params);
    if (trap) {
      *out_trap = trap->I.As<Trap>();
      wasm_trap_delete(trap);
      // Can't use wasm_val_vec_delete since it wasn't populated.
      delete[] results.data;
      return Result::Error;
    }
    wabt_results = ToWabtValues(results.data, results.size);
    wasm_val_vec_delete(&results);
    return Result::Ok;
  };

  // TODO: This finalizer is different from the host_info finalizer.
  return new wasm_func_t{HostFunc::New(store->I, wabt_type, lambda)};
}